

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

wstring * __thiscall
mjs::regexp_flags_to_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,regexp_flag flags)

{
  wchar_t wVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  wVar1 = (wchar_t)__return_storage_ptr__;
  if (((ulong)this & 1) != 0) {
    std::__cxx11::wstring::push_back(wVar1);
  }
  if (((ulong)this & 2) != 0) {
    std::__cxx11::wstring::push_back(wVar1);
  }
  if (((ulong)this & 4) != 0) {
    std::__cxx11::wstring::push_back(wVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring regexp_flags_to_string(regexp_flag flags) {
    std::wstring res;
    if ((flags & regexp_flag::global) != regexp_flag::none)      res.push_back('g');
    if ((flags & regexp_flag::ignore_case) != regexp_flag::none) res.push_back('i');
    if ((flags & regexp_flag::multiline) != regexp_flag::none)   res.push_back('m');
    return res;
}